

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLib.c
# Opt level: O1

Abc_Des_t * Abc_DesCreate(char *pName)

{
  Abc_Des_t *pAVar1;
  size_t sVar2;
  char *__dest;
  st__table *psVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  Hop_Man_t *pHVar6;
  
  pAVar1 = (Abc_Des_t *)malloc(0x38);
  pAVar1->pName = (char *)0x0;
  pAVar1->pManFunc = (void *)0x0;
  pAVar1->vTops = (Vec_Ptr_t *)0x0;
  pAVar1->vModules = (Vec_Ptr_t *)0x0;
  pAVar1->tModules = (st__table *)0x0;
  pAVar1->pLibrary = (Abc_Des_t *)0x0;
  pAVar1->pGenlib = (void *)0x0;
  if (pName == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar2 = strlen(pName);
    __dest = (char *)malloc(sVar2 + 1);
    strcpy(__dest,pName);
  }
  pAVar1->pName = __dest;
  psVar3 = st__init_table(strcmp,st__strhash);
  pAVar1->tModules = psVar3;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  ppvVar5 = (void **)malloc(800);
  pVVar4->pArray = ppvVar5;
  pAVar1->vTops = pVVar4;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  ppvVar5 = (void **)malloc(800);
  pVVar4->pArray = ppvVar5;
  pAVar1->vModules = pVVar4;
  pHVar6 = Hop_ManStart();
  pAVar1->pManFunc = pHVar6;
  pAVar1->pLibrary = (Abc_Des_t *)0x0;
  return pAVar1;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////
 
////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Create the library.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Abc_Des_t * Abc_DesCreate( char * pName )
{
    Abc_Des_t * p;
    p = ABC_ALLOC( Abc_Des_t, 1 );
    memset( p, 0, sizeof(Abc_Des_t) );
    p->pName    = Abc_UtilStrsav( pName );
    p->tModules = st__init_table( strcmp, st__strhash );
    p->vTops    = Vec_PtrAlloc( 100 );
    p->vModules = Vec_PtrAlloc( 100 );
    p->pManFunc = Hop_ManStart();
    p->pLibrary = NULL;
    return p;
}